

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  int iVar1;
  string<unsigned_short> local_28;
  unsigned_short *local_18;
  unsigned_short *pBeginClose;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  pBeginClose = (unsigned_short *)this;
  core::array<irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  this->P = this->P + 1;
  local_18 = this->P;
  while (*this->P != 0x3e) {
    this->P = this->P + 1;
  }
  while (iVar1 = isspace((uint)this->P[-1]), iVar1 != 0) {
    this->P = this->P + -1;
  }
  core::string<unsigned_short>::string<unsigned_short>
            (&local_28,local_18,(s32)((ulong)((long)this->P - (long)local_18) >> 1));
  core::string<unsigned_short>::operator=(&this->NodeName,&local_28);
  core::string<unsigned_short>::~string(&local_28);
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}